

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

string * __thiscall
testing::internal::WideStringToUtf8_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,wchar_t *str,int num_chars)

{
  uint uVar1;
  string *psVar2;
  size_t sVar3;
  uint uVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar5;
  long lVar6;
  bool bVar7;
  stringstream stream;
  string local_1e0;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  uVar4 = (uint)str;
  local_1c0 = __return_storage_ptr__;
  if (uVar4 == 0xffffffff) {
    sVar3 = wcslen((wchar_t *)this);
    uVar4 = (uint)sVar3;
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (0 < (int)uVar4) {
    uVar5 = extraout_RDX;
    lVar6 = 0;
    while (uVar1 = *(uint *)(this + lVar6 * 4), uVar1 != 0) {
      CodePointToUtf8_abi_cxx11_(&local_1e0,(internal *)(ulong)uVar1,(UInt32)uVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
      uVar5 = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        uVar5 = extraout_RDX_01;
      }
      if ((uVar1 == 0) || (bVar7 = (ulong)uVar4 - 1 == lVar6, lVar6 = lVar6 + 1, bVar7)) break;
    }
  }
  psVar2 = local_1c0;
  StringStreamToString(local_1c0,(stringstream *)local_1b8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

std::string WideStringToUtf8(const wchar_t* str, int num_chars) {
  if (num_chars == -1)
    num_chars = static_cast<int>(wcslen(str));

  ::std::stringstream stream;
  for (int i = 0; i < num_chars; ++i) {
    UInt32 unicode_code_point;

    if (str[i] == L'\0') {
      break;
    } else if (i + 1 < num_chars && IsUtf16SurrogatePair(str[i], str[i + 1])) {
      unicode_code_point = CreateCodePointFromUtf16SurrogatePair(str[i],
                                                                 str[i + 1]);
      i++;
    } else {
      unicode_code_point = static_cast<UInt32>(str[i]);
    }

    stream << CodePointToUtf8(unicode_code_point);
  }
  return StringStreamToString(&stream);
}